

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O0

HT_TaskScheduler * ht_task_scheduler_create(HT_ErrorCode *out_err)

{
  HT_ErrorCode local_1c;
  HT_TaskScheduler *pHStack_18;
  HT_ErrorCode error_code;
  HT_TaskScheduler *task_scheduler;
  HT_ErrorCode *out_err_local;
  
  pHStack_18 = (HT_TaskScheduler *)ht_alloc(0x28);
  if (pHStack_18 == (HT_TaskScheduler *)0x0) {
    local_1c = HT_ERR_OUT_OF_MEMORY;
  }
  else {
    local_1c = ht_bag_void_ptr_init((HT_BagVoidPtr *)pHStack_18,0x10);
    if (local_1c == HT_ERR_OK) {
      pHStack_18->next_task_id = 0;
    }
    else {
      ht_free(pHStack_18);
      pHStack_18 = (HT_TaskScheduler *)0x0;
    }
  }
  if (out_err != (HT_ErrorCode *)0x0) {
    *out_err = local_1c;
  }
  return pHStack_18;
}

Assistant:

HT_TaskScheduler*
ht_task_scheduler_create(HT_ErrorCode* out_err)
{
    HT_TaskScheduler* task_scheduler = HT_CREATE_TYPE(HT_TaskScheduler);
    HT_ErrorCode error_code;

    if (task_scheduler == NULL)
    {
        error_code = HT_ERR_OUT_OF_MEMORY;
        goto done;
    }

    error_code = ht_bag_void_ptr_init(&task_scheduler->tasks, DEFAULT_INIT_TASK_COUNT_);
    if (error_code != HT_ERR_OK)
    {
        ht_free(task_scheduler);
        task_scheduler = NULL;
        goto done;
    }

    task_scheduler->next_task_id = 0;

done:
    HT_SET_ERROR(out_err, error_code);

    return task_scheduler;
}